

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

int query_int(char *prompt,int minimum,int maximum)

{
  int iVar1;
  char *pcVar2;
  char str [1024];
  int local_444;
  int local_440;
  int local_43c;
  char local_438 [1032];
  
  local_444 = 0;
  local_440 = minimum;
  local_43c = maximum;
  printf("%s",prompt);
  pcVar2 = fgets(local_438,0x400,_stdin);
  if (pcVar2 != (char *)0x0) {
    do {
      iVar1 = __isoc99_sscanf(local_438,"%d",&local_444);
      if (iVar1 == 1) {
        if (local_440 <= local_444 && local_444 <= local_43c) {
          return local_444;
        }
        puts("Invalid number entered!");
      }
      else {
        puts("Invalid number entered!");
        __isoc99_scanf("%*[^\n]");
      }
      local_444 = 0;
      printf("%s",prompt);
      pcVar2 = fgets(local_438,0x400,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  exit(1);
}

Assistant:

int query_int(const char* prompt, const int minimum, const int maximum) {
  while (true) {
    char str[1024];
    int res = 0;

    printf("%s", prompt);

    if (!fgets(str, 1024, stdin)) exit(1);

    const int scanf_res = sscanf(str, "%d", &res);

    if (scanf_res != 1) {
      printf("Invalid number entered!\n");
      scanf("%*[^\n]");
    } else if (res < minimum || res > maximum) {
      printf("Invalid number entered!\n");
    } else {
      return res;
    }
  }
}